

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O1

uint32_t rebuild_hflags_m32(CPUARMState_conflict *env,int fp_el,ARMMMUIdx mmu_idx)

{
  uint32_t uVar1;
  uint32_t in_ECX;
  ARMMMUIdx flags;
  ARMMMUIdx AVar2;
  ARMMMUIdx AVar3;
  
  AVar2 = (uint)((env->v7m).exception != 0) << 9;
  if (((env->features & 0x8000000) != 0) &&
     (((fp_el & 2U) == 0 ||
      ((*(byte *)((long)(env->v7m).ccr + (ulong)(env->v7m).secure * 4 + 1) & 4) == 0)))) {
    uVar1 = rebuild_hflags_common_32(env,fp_el,AVar2 | 0x400,in_ECX);
    return uVar1;
  }
  AVar3 = 0x20000;
  if ((env->features & 0x210000000) == 0x200000000) {
    AVar3 = ((uint)(env->cp15).scr_el3 & 1) << 0x11;
  }
  flags = ((uint)(env->cp15).field_2.field_0.sctlr_ns & 0x80) << 8;
  uVar1 = rebuild_hflags_common
                    (env,fp_el,AVar2 | flags | (env->uncached_cpsr & 0x200) << 0x13 | AVar3,flags);
  return uVar1;
}

Assistant:

static inline bool arm_v7m_is_handler_mode(CPUARMState *env)
{
    return env->v7m.exception != 0;
}